

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_deserialize_set_element
          (t_java_generator *this,ostream *out,t_set *tset,string *prefix,string *obj,
          bool has_metadata)

{
  int iVar1;
  ostream *poVar2;
  t_type *ptVar3;
  string i;
  string elem;
  t_field felem;
  allocator local_1a1;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  std::__cxx11::string::string((string *)&local_100,"_elem",(allocator *)&local_e0);
  t_generator::tmp(&local_180,(t_generator *)this,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  ptVar3 = tset->elem_type_;
  std::__cxx11::string::string((string *)&local_120,(string *)&local_180);
  t_field::t_field(&local_e0,ptVar3,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_1a0,this,&local_e0,this->reuse_objects_,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string((string *)&local_140,"_i",&local_1a1);
  t_generator::tmp(&local_1a0,(t_generator *)this,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"for (int ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
  poVar2 = std::operator<<(poVar2," = 0; ");
  poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
  poVar2 = std::operator<<(poVar2," < ");
  poVar2 = std::operator<<(poVar2,(string *)obj);
  poVar2 = std::operator<<(poVar2,".size");
  poVar2 = std::operator<<(poVar2,"; ");
  poVar2 = std::operator<<(poVar2,"++");
  poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
  poVar2 = std::operator<<(poVar2,")");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string((string *)&local_160,"",&local_1a1);
  generate_deserialize_field(this,out,&local_e0,&local_160,has_metadata);
  std::__cxx11::string::~string((string *)&local_160);
  ptVar3 = t_type::get_true_type(local_e0.type_);
  iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
  if ((char)iVar1 != '\0') {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"if (");
    poVar2 = std::operator<<(poVar2,(string *)&local_180);
    poVar2 = std::operator<<(poVar2," != null)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".add(");
  poVar2 = std::operator<<(poVar2,(string *)&local_180);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_type::get_true_type(local_e0.type_);
  iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[10])(ptVar3);
  if ((char)iVar1 != '\0') {
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  }
  if (this->reuse_objects_ == true) {
    ptVar3 = t_type::get_true_type(local_e0.type_);
    iVar1 = (*(ptVar3->super_t_doc)._vptr_t_doc[5])(ptVar3);
    if ((char)iVar1 == '\0') {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,(string *)&local_180);
      poVar2 = std::operator<<(poVar2," = null;");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
  }
  std::__cxx11::string::~string((string *)&local_1a0);
  t_field::~t_field(&local_e0);
  std::__cxx11::string::~string((string *)&local_180);
  return;
}

Assistant:

void t_java_generator::generate_deserialize_set_element(ostream& out,
                                                        t_set* tset,
                                                        string prefix,
                                                        string obj,
                                                        bool has_metadata) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem, reuse_objects_, false) << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for (int " << i << " = 0; " << i << " < " << obj << ".size"
              << "; "
              << "++" << i << ")" << endl;
  scope_up(out);

  generate_deserialize_field(out, &felem, "", has_metadata);

  if (get_true_type(felem.get_type())->is_enum()) {
    indent(out) << "if (" << elem << " != null)" << endl;
    scope_up(out);
  }

  indent(out) << prefix << ".add(" << elem << ");" << endl;

  if (get_true_type(felem.get_type())->is_enum()) {
    scope_down(out);
  }

  if (reuse_objects_ && !get_true_type(felem.get_type())->is_base_type()) {
    indent(out) << elem << " = null;" << endl;
  }
}